

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_melee_critical_level(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  void *pvVar3;
  char *name;
  undefined8 *puVar4;
  long *local_40;
  critical_level *cursor;
  wchar_t msgt;
  char *msgt_str;
  critical_level *new_level;
  angband_constants *z;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  name = parser_getstr(p,"msg");
  iVar1 = message_lookup_by_name(name);
  if (iVar1 < 0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_MESSAGE;
  }
  else {
    puVar4 = (undefined8 *)mem_alloc(0x18);
    *puVar4 = 0;
    wVar2 = parser_getint(p,"cutoff");
    *(wchar_t *)(puVar4 + 1) = wVar2;
    wVar2 = parser_getint(p,"mult");
    *(wchar_t *)((long)puVar4 + 0xc) = wVar2;
    wVar2 = parser_getint(p,"add");
    *(wchar_t *)(puVar4 + 2) = wVar2;
    *(int *)((long)puVar4 + 0x14) = iVar1;
    if (*(long *)((long)pvVar3 + 0xc0) == 0) {
      *(undefined8 **)((long)pvVar3 + 0xc0) = puVar4;
    }
    else {
      for (local_40 = *(long **)((long)pvVar3 + 0xc0); *local_40 != 0; local_40 = (long *)*local_40)
      {
      }
      *local_40 = (long)puVar4;
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_melee_critical_level(struct parser *p)
{
	struct angband_constants *z = parser_priv(p);
	struct critical_level *new_level;
	const char *msgt_str = parser_getstr(p, "msg");
	int msgt = message_lookup_by_name(msgt_str);

	if (msgt < 0) {
		return PARSE_ERROR_INVALID_MESSAGE;
	}
	new_level = mem_alloc(sizeof(*new_level));
	new_level->next = NULL;
	new_level->cutoff = parser_getint(p, "cutoff");
	new_level->mult = parser_getint(p, "mult");
	new_level->add = parser_getint(p, "add");
	new_level->msgt = msgt;
	/* Add it to the end of the linked list. */
	if (z->m_crit_level_head) {
		struct critical_level *cursor = z->m_crit_level_head;

		while (cursor->next) {
			cursor = cursor->next;
		}
		cursor->next = new_level;
	} else {
		z->m_crit_level_head = new_level;
	}

	return PARSE_ERROR_NONE;
}